

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU(Environmental_Process_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Environmental_Process_PDU_00224228;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID);
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType);
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vEnvRecords).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui8ModelType = '\0';
  this->field_3 = (anon_union_1_2_30240dc3_for_Environmental_Process_PDU_4)0x0;
  this->m_ui16NumEnvRec = 0;
  this->m_ui16SeqNum = 0;
  (this->super_Header).super_Header6.m_ui8PDUType = ')';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Environmental_Process_PDU::Environmental_Process_PDU() :
    m_ui8ModelType( 0 ),
    m_ui8EnvStatus( 0 ),
    m_ui16NumEnvRec( 0 ),
    m_ui16SeqNum( 0 )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = EnvironmentalProcess_PDU_Type;
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}